

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_tools_sound_envs.cxx
# Opt level: O2

void __thiscall temp_box::collect(temp_box *this,cf_face *face,cf_vertex_vec *verts)

{
  long lVar1;
  _vector3<float> *v;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  uint uVar7;
  uint uVar8;
  pointer pcVar9;
  ulong uVar10;
  ulong uVar11;
  char *__assertion;
  undefined1 *puVar12;
  undefined1 *puVar13;
  long lVar14;
  float fVar15;
  fvector3 edge [2];
  anon_union_12_2_77b31271_for__vector3<float>_1 local_38;
  
  if ((face->field_1).dummy >> 0x10 == (uint)this->inner) {
    if (((face->field_1).dummy & 0x3fff) == (uint)this->outer) {
      if (this->state != 1) {
        uVar7 = this->base_idx;
        puVar12 = (undefined1 *)((long)&face->field_0 + 0x14);
        puVar13 = (undefined1 *)((long)&face->field_0 + 0x10);
        uVar11 = 5;
        uVar10 = 4;
        lVar14 = 2;
        do {
          if (lVar14 == -1) {
            return;
          }
          puVar12 = puVar12 + -4;
          uVar11 = uVar11 - 1;
          puVar13 = puVar13 + -4;
          uVar10 = uVar10 - 1;
          lVar1 = lVar14 * 4;
          lVar14 = lVar14 + -1;
        } while (*(uint *)((long)&face->field_0 + lVar1) != uVar7);
        uVar8 = *(uint *)(puVar13 + (uVar10 / 3) * -0xc);
        pcVar9 = (verts->super__Vector_base<xray_re::cf_vertex,_std::allocator<xray_re::cf_vertex>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        fVar15 = pcVar9[uVar7].p.field_0.field_0.x;
        edge[0].field_0._0_4_ = pcVar9[uVar8].p.field_0.field_0.x - fVar15;
        fVar2 = pcVar9[uVar7].p.field_0.field_0.y;
        edge[0].field_0._4_4_ = pcVar9[uVar8].p.field_0.field_0.y - fVar2;
        fVar3 = pcVar9[uVar7].p.field_0.field_0.z;
        edge[0].field_0._8_4_ = pcVar9[uVar8].p.field_0.field_0.z - fVar3;
        uVar7 = *(uint *)(puVar12 + (uVar11 / 3) * -0xc);
        edge[1].field_0._0_4_ = pcVar9[uVar7].p.field_0.field_0.x - fVar15;
        edge[1].field_0._4_4_ = pcVar9[uVar7].p.field_0.field_0.y - fVar2;
        edge[1].field_0._8_4_ = pcVar9[uVar7].p.field_0.field_0.z - fVar3;
        for (lVar14 = 0xc; lVar14 != -0xc; lVar14 = lVar14 + -0xc) {
          v = (_vector3<float> *)((long)&edge[0].field_0 + lVar14);
          fVar15 = xray_re::_vector3<float>::cosine((_vector3<float> *)&this->xform,v);
          if (((float)(~-(uint)(fVar15 < 0.0) & (uint)fVar15 |
                      (uint)(0.0 - fVar15) & -(uint)(fVar15 < 0.0)) < 0.001) &&
             (fVar15 = xray_re::_vector3<float>::cosine(&(this->xform).field_0.field_1.j,v),
             (float)(~-(uint)(fVar15 < 0.0) & (uint)fVar15 |
                    (uint)(0.0 - fVar15) & -(uint)(fVar15 < 0.0)) < 0.001)) {
            uVar4 = *(undefined8 *)((long)&edge[0].field_0 + lVar14);
            *(undefined8 *)((long)&(this->xform).field_0 + 0x20) = uVar4;
            fVar15 = *(float *)((long)&edge[0].field_0 + lVar14 + 8);
            (this->xform).field_0.field_0._33 = fVar15;
            this->state = 1;
            uVar5 = *(undefined8 *)&(this->xform).field_0;
            uVar6 = *(undefined8 *)((long)&(this->xform).field_0 + 0x10);
            local_38._0_8_ =
                 CONCAT44(((float)((ulong)uVar6 >> 0x20) + (float)((ulong)uVar5 >> 0x20) +
                          (float)((ulong)uVar4 >> 0x20)) * 0.5,
                          ((float)uVar6 + (float)uVar5 + (float)uVar4) * 0.5);
            local_38.field_0.z =
                 ((this->xform).field_0.field_0._13 + (this->xform).field_0.field_0._23 + fVar15) *
                 0.5;
            xray_re::_vector3<float>::add
                      (&(this->xform).field_0.field_1.c,(_vector3<float> *)&local_38.field_0);
            return;
          }
        }
      }
      return;
    }
    __assertion = "outer == face.material";
    uVar7 = 0x37;
  }
  else {
    __assertion = "inner == face.sector";
    uVar7 = 0x36;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/utils/converter/level_tools_sound_envs.cxx"
                ,uVar7,"void temp_box::collect(const cf_face &, const cf_vertex_vec &)");
}

Assistant:

void temp_box::collect(const cf_face& face, const cf_vertex_vec& verts)
{
	// FIXME: this code will not work in a (legal) situation with intersecting
	// sound volumes. So far I am not aware of any real examples, though.
	xr_assert(inner == face.sector);
	xr_assert(outer == face.material);
	if (state == STATE_DONE)
		return;
	for (uint_fast32_t k = 3; k != 0;) {
		if (face.v[--k] != base_idx)
			continue;
		fvector3 edge[2];
		edge[0].sub(verts[face.v[(k+1)%3]].p, verts[face.v[k]].p);
		edge[1].sub(verts[face.v[(k+2)%3]].p, verts[face.v[k]].p);
		for (uint_fast32_t i = 2; i != 0;) {
			--i;
			if (equivalent(xform.i.cosine(edge[i]), 0.f, k_zero_tolerance) &&
					equivalent(xform.j.cosine(edge[i]), 0.f, k_zero_tolerance)) {
				xform.k.set(edge[i]);
				state = STATE_DONE;
				xform.c.add(fvector3().add(xform.i, xform.j).add(xform.k).mul(0.5f));
				return;
			}
		}
		break;
	}
}